

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

string * __thiscall
nonius::detail::units_for_magnitude_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,double magnitude)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if (magnitude <= 1.0) {
    pcVar2 = "s";
    paVar1 = &local_9;
  }
  else if (magnitude <= 1000.0) {
    pcVar2 = "ms";
    paVar1 = &local_a;
  }
  else if (magnitude <= 1000000.0) {
    pcVar2 = anon_var_dwarf_65794;
    paVar1 = &local_b;
  }
  else {
    pcVar2 = "ns";
    paVar1 = &local_c;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

inline std::string units_for_magnitude(double magnitude) {
            if(magnitude <= 1.e0) return "s";
            else if(magnitude <= 1.e3) return "ms";
            else if(magnitude <= 1.e6) return "μs";
            else return "ns";
        }